

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserUtilsTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserUtilsTest_isLowerCaseTest_Test::OpenDDLParserUtilsTest_isLowerCaseTest_Test
          (OpenDDLParserUtilsTest_isLowerCaseTest_Test *this)

{
  OpenDDLParserUtilsTest::OpenDDLParserUtilsTest(&this->super_OpenDDLParserUtilsTest);
  (this->super_OpenDDLParserUtilsTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_0017c860;
  return;
}

Assistant:

TEST_F( OpenDDLParserUtilsTest, isLowerCaseTest ) {
    char val = 'A';
    EXPECT_TRUE( isUpperCase<char>( val ) );
    val = 'C';
    EXPECT_TRUE( isUpperCase<char>( val ) );
    val = 'Z';
    EXPECT_TRUE( isUpperCase<char>( val ) );
    val = 'a';
    EXPECT_FALSE( isUpperCase<char>( val ) );
    val = '0';
    EXPECT_FALSE( isUpperCase<char>( val ) );
}